

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

int set_FMPtrField_by_name(FMFieldList field_list,char *fieldname,void *data,void *ptr_value)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  int index;
  int local_2c;
  uint local_4;
  
  local_2c = 0;
  while ((*(long *)(in_RDI + (long)local_2c * 0x18) != 0 &&
         (iVar1 = strcmp(*(char **)(in_RDI + (long)local_2c * 0x18),in_RSI), iVar1 != 0))) {
    local_2c = local_2c + 1;
  }
  bVar2 = *(long *)(in_RDI + (long)local_2c * 0x18) != 0;
  if (bVar2) {
    *(undefined8 *)(in_RDX + *(int *)(in_RDI + (long)local_2c * 0x18 + 0x14)) = in_RCX;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

extern int
set_FMPtrField_by_name(FMFieldList field_list, const char *fieldname, void *data, void *ptr_value)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return 0;

    
    *((void**)(((char*)data) + field_list[index].field_offset)) = ptr_value;
    return 1;
}